

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall pbrt::ParsedScene::EndOfFiles(ParsedScene *this)

{
  pointer *ppTVar1;
  pointer pTVar2;
  
  if (this->currentApiState != WorldBlock) {
    (this->super_SceneRepresentation).errorExit = true;
    Error<>("End of files before \"WorldBegin\".");
  }
  while ((this->pushedGraphicsStates).
         super__Vector_base<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         (this->pushedGraphicsStates).
         super__Vector_base<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
         ._M_impl.super__Vector_impl_data._M_finish) {
    (this->super_SceneRepresentation).errorExit = true;
    Error<>("Missing end to AttributeBegin");
    std::vector<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
    ::pop_back(&this->pushedGraphicsStates);
    ppTVar1 = &(this->pushedTransforms).
               super__Vector_base<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppTVar1 = *ppTVar1 + -1;
  }
  pTVar2 = (this->pushedTransforms).
           super__Vector_base<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_>._M_impl.
           super__Vector_impl_data._M_finish;
  while ((this->pushedTransforms).
         super__Vector_base<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_>._M_impl.
         super__Vector_impl_data._M_start != pTVar2) {
    (this->super_SceneRepresentation).errorExit = true;
    Error<>("Missing end to TransformBegin");
    pTVar2 = (this->pushedTransforms).
             super__Vector_base<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
    (this->pushedTransforms).
    super__Vector_base<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_>._M_impl.
    super__Vector_impl_data._M_finish = pTVar2;
  }
  if ((this->super_SceneRepresentation).errorExit != true) {
    return;
  }
  ErrorExit<>("Fatal errors during scene construction");
}

Assistant:

void ParsedScene::EndOfFiles() {
    if (currentApiState != APIState::WorldBlock)
        ErrorExitDeferred("End of files before \"WorldBegin\".");

    // Ensure there are no pushed graphics states
    while (!pushedGraphicsStates.empty()) {
        ErrorExitDeferred("Missing end to AttributeBegin");
        pushedGraphicsStates.pop_back();
        pushedTransforms.pop_back();
    }
    while (!pushedTransforms.empty()) {
        ErrorExitDeferred("Missing end to TransformBegin");
        pushedTransforms.pop_back();
    }

    if (errorExit)
        ErrorExit("Fatal errors during scene construction");
}